

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::Array2D<pbrt::RGBFilm::Pixel>::Array2D
          (Array2D<pbrt::RGBFilm::Pixel> *this,Bounds2i *extent,Allocator allocator)

{
  undefined8 *puVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  Pixel *pPVar3;
  uint uVar4;
  long lVar5;
  polymorphic_allocator<std::byte> local_20;
  
  TVar2 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar2;
  (this->allocator).memoryResource = allocator.memoryResource;
  uVar4 = ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.y -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.y) *
          ((extent->pMax).super_Tuple2<pbrt::Point2,_int>.x -
          (extent->pMin).super_Tuple2<pbrt::Point2,_int>.x);
  local_20.memoryResource = allocator.memoryResource;
  pPVar3 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::RGBFilm::Pixel>
                     (&local_20,(long)(int)uVar4);
  this->values = pPVar3;
  for (lVar5 = 0; (ulong)(~((int)uVar4 >> 0x1f) & uVar4) * 0x38 - lVar5 != 0; lVar5 = lVar5 + 0x38)
  {
    pPVar3 = this->values;
    puVar1 = (undefined8 *)((long)(pPVar3->splatRGB + -1) + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1 = (undefined8 *)((long)pPVar3->rgbSum + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    RGBFilm::Pixel::Pixel((Pixel *)((long)pPVar3->rgbSum + lVar5));
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, Allocator allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }